

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

int AddTimeout(stTimeout_t *apTimeout,stTimeoutItem_t *apItem,unsigned_long_long allNow)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = apTimeout->ullStart;
  if (uVar2 == 0) {
    apTimeout->ullStart = allNow;
    apTimeout->llStartIdx = 0;
    uVar2 = allNow;
  }
  else if (allNow < uVar2) {
    return 0x188;
  }
  iVar3 = 399;
  if (allNow <= apItem->ullExpireTime) {
    uVar2 = apItem->ullExpireTime - uVar2;
    uVar4 = (ulong)apTimeout->iItemSize;
    uVar1 = uVar4 - 1;
    if (uVar2 < uVar4) {
      uVar1 = uVar2;
    }
    iVar3 = 0;
    AddTail<stTimeoutItem_t,stTimeoutItemLink_t>
              (apTimeout->pItems + (uVar1 + apTimeout->llStartIdx) % uVar4,apItem);
  }
  return iVar3;
}

Assistant:

int AddTimeout( stTimeout_t *apTimeout,stTimeoutItem_t *apItem ,unsigned long long allNow )
{
	if( apTimeout->ullStart == 0 )
	{
		apTimeout->ullStart = allNow;
		apTimeout->llStartIdx = 0;
	}
	if( allNow < apTimeout->ullStart )
	{
		co_log_err("CO_ERR: AddTimeout line %d allNow %llu apTimeout->ullStart %llu",
					__LINE__,allNow,apTimeout->ullStart);

		return __LINE__;
	}
	if( apItem->ullExpireTime < allNow )
	{
		co_log_err("CO_ERR: AddTimeout line %d apItem->ullExpireTime %llu allNow %llu apTimeout->ullStart %llu",
					__LINE__,apItem->ullExpireTime,allNow,apTimeout->ullStart);

		return __LINE__;
	}
	unsigned long long diff = apItem->ullExpireTime - apTimeout->ullStart;

	if( diff >= (unsigned long long)apTimeout->iItemSize )
	{
		diff = apTimeout->iItemSize - 1;
		co_log_err("CO_ERR: AddTimeout line %d diff %d",
					__LINE__,diff);

		//return __LINE__;
	}
	AddTail( apTimeout->pItems + ( apTimeout->llStartIdx + diff ) % apTimeout->iItemSize , apItem );

	return 0;
}